

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O0

void cp_push_type(CPDecl *decl,CTypeID id)

{
  CPDeclIdx CVar1;
  uint *puVar2;
  CPDecl *decl_00;
  uint in_ESI;
  long in_RDI;
  CTSize size;
  CTInfo info;
  CType *ct;
  CTSize in_stack_ffffffffffffffa8;
  CTInfo in_stack_ffffffffffffffac;
  CTInfo info_00;
  CPDecl *in_stack_ffffffffffffffb0;
  CTypeID id_00;
  undefined4 in_stack_ffffffffffffffd0;
  
  puVar2 = (uint *)(**(long **)(*(long *)(in_RDI + 0x10) + 0x40) + (ulong)in_ESI * 0x10);
  id_00 = (CTypeID)((ulong)puVar2 >> 0x20);
  switch(*puVar2 >> 0x1c) {
  case 1:
  case 5:
    cp_push(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
    if ((*(uint *)(in_RDI + 0x2c) & 0x3000000) != 0) {
      cp_push(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
      *(uint *)(in_RDI + 0x2c) = *(uint *)(in_RDI + 0x2c) & 0xfcffffff;
    }
    break;
  default:
    cp_push(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
    *(uint *)(in_RDI + 0x2c) = *(uint *)(in_RDI + 0x2c) & 0xfcffffff;
    break;
  case 3:
    if ((*puVar2 & 0xc000000) != 0) {
      *(uint *)(in_RDI + 0x2c) = *(uint *)(in_RDI + 0x2c) & 0xfcffffff;
    }
    cp_push_type((CPDecl *)CONCAT44(in_ESI,in_stack_ffffffffffffffd0),id_00);
    cp_push(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
    *(undefined2 *)(in_RDI + (ulong)*(uint *)(in_RDI + 4) * 0x10 + 0x48) = 1;
    break;
  case 6:
    info_00 = CONCAT22((short)puVar2[2],(short)in_stack_ffffffffffffffac);
    decl_00 = (CPDecl *)(in_RDI + 0x40);
    CVar1 = cp_push(decl_00,info_00,in_stack_ffffffffffffffa8);
    decl_00->stack[(ulong)CVar1 - 4].sib = (CTypeID1)(info_00 >> 0x10);
    break;
  case 8:
    if ((*puVar2 & 0xf0ff0000) == 0x80010000) {
      *(uint *)(in_RDI + 0x2c) = (puVar2[1] ^ 0xffffffff) & *(uint *)(in_RDI + 0x2c);
    }
    cp_push_type((CPDecl *)CONCAT44(in_ESI,in_stack_ffffffffffffffd0),id_00);
    cp_push(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
  }
  return;
}

Assistant:

static void cp_push_type(CPDecl *decl, CTypeID id)
{
  CType *ct = ctype_get(decl->cp->cts, id);
  CTInfo info = ct->info;
  CTSize size = ct->size;
  switch (ctype_type(info)) {
  case CT_STRUCT: case CT_ENUM:
    cp_push(decl, CTINFO(CT_TYPEDEF, id), 0);  /* Don't copy unique types. */
    if ((decl->attr & CTF_QUAL)) {  /* Push unmerged qualifiers. */
      cp_push(decl, CTINFO(CT_ATTRIB, CTATTRIB(CTA_QUAL)),
	      (decl->attr & CTF_QUAL));
      decl->attr &= ~CTF_QUAL;
    }
    break;
  case CT_ATTRIB:
    if (ctype_isxattrib(info, CTA_QUAL))
      decl->attr &= ~size;  /* Remove redundant qualifiers. */
    cp_push_type(decl, ctype_cid(info));  /* Unroll. */
    cp_push(decl, info & ~CTMASK_CID, size);  /* Copy type. */
    break;
  case CT_ARRAY:
    if ((ct->info & (CTF_VECTOR|CTF_COMPLEX))) {
      info |= (decl->attr & CTF_QUAL);
      decl->attr &= ~CTF_QUAL;
    }
    cp_push_type(decl, ctype_cid(info));  /* Unroll. */
    cp_push(decl, info & ~CTMASK_CID, size);  /* Copy type. */
    decl->stack[decl->pos].sib = 1;  /* Mark as already checked and sized. */
    /* Note: this is not copied to the ct->sib in the C type table. */
    break;
  case CT_FUNC:
    /* Copy type, link parameters (shared). */
    decl->stack[cp_push(decl, info, size)].sib = ct->sib;
    break;
  default:
    /* Copy type, merge common qualifiers. */
    cp_push(decl, info|(decl->attr & CTF_QUAL), size);
    decl->attr &= ~CTF_QUAL;
    break;
  }
}